

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_BrepFace * __thiscall
ON_Brep::NewFace(ON_Brep *this,ON_Surface *pSurface,int *vid,int *eid,bool *bRev3d)

{
  int iVar1;
  int iVar2;
  ON_Surface **ppOVar3;
  ON_BrepFace *pOVar4;
  ON_BrepLoop *pOVar5;
  bool bVar6;
  int local_4c;
  int face_index;
  int si;
  ON_BrepFace *pFace;
  bool bAddedSurface;
  bool *bRev3d_local;
  int *eid_local;
  int *vid_local;
  ON_Surface *pSurface_local;
  ON_Brep *this_local;
  
  ON_BoundingBox::Destroy(&this->m_bbox);
  this->m_is_solid = 0;
  bVar6 = false;
  _face_index = (ON_Brep *)0x0;
  if (pSurface == (ON_Surface *)0x0) {
    this_local = (ON_Brep *)0x0;
  }
  else {
    local_4c = 0;
    while ((iVar1 = ON_SimpleArray<ON_Surface_*>::Count
                              (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>), local_4c < iVar1 &&
           (ppOVar3 = ON_SimpleArray<ON_Surface_*>::operator[]
                                (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,local_4c),
           pSurface != *ppOVar3))) {
      local_4c = local_4c + 1;
    }
    iVar1 = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
    if (iVar1 <= local_4c) {
      local_4c = AddSurface(this,pSurface);
      bVar6 = -1 < local_4c;
    }
    pOVar4 = NewFace(this,local_4c);
    iVar1 = pOVar4->m_face_index;
    pOVar5 = NewOuterLoop(this,iVar1,vid,eid,bRev3d);
    if (pOVar5 == (ON_BrepLoop *)0x0) {
      if (bVar6) {
        ppOVar3 = ON_SimpleArray<ON_Surface_*>::operator[]
                            (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,local_4c);
        *ppOVar3 = (ON_Surface *)0x0;
        iVar2 = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>)
        ;
        if (iVar2 == local_4c + 1) {
          ON_SimpleArray<ON_Surface_*>::SetCount
                    (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,local_4c);
        }
      }
      pOVar4 = ON_ClassArray<ON_BrepFace>::operator[]
                         ((ON_ClassArray<ON_BrepFace> *)&this->m_F,iVar1);
      DeleteFace(this,pOVar4,false);
      iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
      if (iVar2 == iVar1 + 1) {
        ON_ClassArray<ON_BrepFace>::SetCount((ON_ClassArray<ON_BrepFace> *)&this->m_F,iVar1);
      }
    }
    else {
      _face_index = (ON_Brep *)
                    ON_ClassArray<ON_BrepFace>::operator[]
                              ((ON_ClassArray<ON_BrepFace> *)&this->m_F,iVar1);
    }
    this_local = _face_index;
  }
  return (ON_BrepFace *)this_local;
}

Assistant:

ON_BrepFace* ON_Brep::NewFace(
       ON_Surface* pSurface,
       int vid[4],
       int eid[4],
       bool bRev3d[4]
       )
{
  m_bbox.Destroy();
  m_is_solid = 0;
  bool bAddedSurface = false;
  ON_BrepFace* pFace = nullptr;
  if ( !pSurface )
    return nullptr;
  int si;
  for ( si = 0; si < m_S.Count(); si++ )
  {
    if ( pSurface == m_S[si] )
      break;
  }
  if ( si >= m_S.Count() )
  {
    si = AddSurface(pSurface);
    bAddedSurface = (si >= 0);
  }
  int face_index = NewFace(si).m_face_index;
  if ( NewOuterLoop( face_index, vid, eid, bRev3d ) )
  {
    pFace = &m_F[face_index];
  }
  else 
  {
    // failed
    if ( bAddedSurface )
    {
      m_S[si] = 0;
      if ( m_S.Count() == si+1 )
        m_S.SetCount(si);
    }
    DeleteFace( m_F[face_index], false );
    if ( m_F.Count() == face_index+1 )
    {
      m_F.SetCount(face_index);
    }
  }
  return pFace;
}